

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_parameters.cpp
# Opt level: O3

int __thiscall cpp_db::sqlite_parameters::find_param_pos(sqlite_parameters *this,string *name)

{
  int iVar1;
  sqlite3_stmt *psVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_type *local_40;
  size_type local_38;
  size_type local_30;
  undefined8 uStack_28;
  
  psVar2 = get_stmt_handle(this);
  iVar1 = sqlite3_bind_parameter_index(psVar2,(name->_M_dataplus)._M_p);
  if (iVar1 != 0) {
    return iVar1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_60,"Index for SQL parameter \'",name);
  pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_60,"\' not found!");
  local_40 = (size_type *)(pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40 == paVar4) {
    local_30 = paVar4->_M_allocated_capacity;
    uStack_28 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_40 = &local_30;
  }
  else {
    local_30 = paVar4->_M_allocated_capacity;
  }
  local_38 = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00116858;
  __cxa_throw(this_00,&db_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int sqlite_parameters::find_param_pos(const std::string &name) const
{
	if (int pos = sqlite3_bind_parameter_index(get_stmt_handle(), name.c_str()))
        return pos;
    else
        throw db_exception("Index for SQL parameter '" + name + "' not found!");
}